

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_PiecewiseLinearExprPrecedence_Test::
~ExprWriterTest_PiecewiseLinearExprPrecedence_Test
          (ExprWriterTest_PiecewiseLinearExprPrecedence_Test *this)

{
  ExprWriterTest_PiecewiseLinearExprPrecedence_Test *in_stack_00000010;
  
  ~ExprWriterTest_PiecewiseLinearExprPrecedence_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_F(ExprWriterTest, PiecewiseLinearExprPrecedence) {
  auto plterm = BeginPLTerm(2);
  plterm.AddSlope(-1);
  plterm.AddBreakpoint(5);
  plterm.AddSlope(0);
  plterm.AddBreakpoint(10);
  plterm.AddSlope(1);
  CHECK_WRITE("<<5, 10; -1, 0, 1>> x43 ^ 2",
      MakeBinary(ex::POW, EndPLTerm(plterm, MakeVariable(42)), MakeConst(2)));
}